

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_exp2nextreg(FuncState *fs,expdesc *e)

{
  int iVar1;
  byte bVar2;
  
  luaK_dischargevars(fs,e);
  if (e->k == VNONRELOC) {
    iVar1 = (e->u).info;
    bVar2 = luaY_nvarstack(fs);
    if ((int)(uint)bVar2 <= iVar1) {
      fs->freereg = fs->freereg + 0xff;
    }
  }
  luaK_checkstack(fs,1);
  bVar2 = fs->freereg + 1;
  fs->freereg = bVar2;
  exp2reg(fs,e,bVar2 - 1);
  return;
}

Assistant:

void luaK_exp2nextreg (FuncState *fs, expdesc *e) {
  luaK_dischargevars(fs, e);
  freeexp(fs, e);
  luaK_reserveregs(fs, 1);
  exp2reg(fs, e, fs->freereg - 1);
}